

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O2

bool __thiscall
cmSourceGroupCommand::processTree
          (cmSourceGroupCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errorMsg)

{
  pointer pbVar1;
  string *psVar2;
  cmMakefile *this_00;
  int iVar3;
  bool bVar4;
  char *pcVar5;
  cmSourceGroup *this_01;
  _Base_ptr p_Var6;
  string *in_name;
  long lVar7;
  ulong uVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokenizedPath;
  string fullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesVector;
  string local_d8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceGroupPaths;
  string root;
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  bVar4 = checkTreeArgumentsPreconditions(this,args,errorMsg);
  if (bVar4) {
    cmsys::SystemTools::CollapseFullPath
              (&root,(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1);
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    prefix._M_string_length = 0;
    prefix.field_2._M_local_buf[0] = '\0';
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"PREFIX");
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&prefix);
      iVar3 = 5;
    }
    else {
      iVar3 = 3;
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&tokenizedPath,pcVar5,(allocator *)&local_48);
    filesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    filesVector.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (in_name = (string *)((long)&(pbVar1->_M_dataplus)._M_p + (ulong)(uint)(iVar3 << 5));
        in_name != psVar2; in_name = in_name + 1) {
      bVar4 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (bVar4) {
        cmsys::SystemTools::CollapseFullPath(&local_d8,in_name);
      }
      else {
        std::operator+(&fullPath,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tokenizedPath,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sourceGroupPaths,&fullPath,in_name);
        cmsys::SystemTools::CollapseFullPath
                  (&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &sourceGroupPaths);
        std::__cxx11::string::~string((string *)&sourceGroupPaths);
        std::__cxx11::string::~string((string *)&fullPath);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filesVector,
                 &local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::__cxx11::string::~string((string *)&tokenizedPath);
    lVar7 = 0;
    uVar8 = 0;
    while( true ) {
      if ((ulong)((long)filesVector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)filesVector.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar8) break;
      bVar4 = cmsys::SystemTools::StringStartsWith
                        ((string *)
                         ((long)&((filesVector.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar7),root._M_dataplus._M_p);
      if (!bVar4) {
        std::operator+(&local_d8,"ROOT: ",&root);
        std::operator+(&fullPath,&local_d8," is not a prefix of file: ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sourceGroupPaths,&fullPath,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&((filesVector.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar7));
        std::__cxx11::string::operator=((string *)errorMsg,(string *)&sourceGroupPaths);
        std::__cxx11::string::~string((string *)&sourceGroupPaths);
        std::__cxx11::string::~string((string *)&fullPath);
        std::__cxx11::string::~string((string *)&local_d8);
        bVar4 = false;
        goto LAB_0032f1f8;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x20;
    }
    sourceGroupPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &sourceGroupPaths._M_t._M_impl.super__Rb_tree_header._M_header;
    sourceGroupPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    sourceGroupPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    sourceGroupPaths._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar7 = 0;
    sourceGroupPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         sourceGroupPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar8 = 0;
        uVar8 < (ulong)((long)filesVector.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)filesVector.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar8 = uVar8 + 1) {
      std::__cxx11::string::substr
                ((ulong)&fullPath,
                 (long)&((filesVector.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&sourceGroupPaths,&fullPath);
      std::__cxx11::string::~string((string *)&fullPath);
      lVar7 = lVar7 + 0x20;
    }
    this_00 = (this->super_cmCommand).Makefile;
    for (p_Var6 = sourceGroupPaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar4 = (_Rb_tree_header *)p_Var6 == &sourceGroupPaths._M_t._M_impl.super__Rb_tree_header,
        !bVar4; p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      tokenizedPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tokenizedPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tokenizedPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (prefix._M_string_length == 0) {
        anon_unknown.dwarf_48ff4b::tokenizePath
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&fullPath,(string *)(p_Var6 + 1));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&tokenizedPath,&fullPath);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fullPath);
      }
      else {
        std::operator+(&local_d8,&prefix,'/');
        std::operator+(&fullPath,&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var6 + 1));
        anon_unknown.dwarf_48ff4b::tokenizePath(&local_48,&fullPath);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign(&tokenizedPath,&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        std::__cxx11::string::~string((string *)&fullPath);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      if (0x20 < (ulong)((long)tokenizedPath.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)tokenizedPath.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        tokenizedPath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             tokenizedPath.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::__cxx11::string::~string
                  ((string *)
                   tokenizedPath.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        this_01 = cmMakefile::GetSourceGroup(this_00,&tokenizedPath);
        if (this_01 == (cmSourceGroup *)0x0) {
          cmMakefile::AddSourceGroup(this_00,&tokenizedPath,(char *)0x0);
          this_01 = cmMakefile::GetSourceGroup(this_00,&tokenizedPath);
          if (this_01 == (cmSourceGroup *)0x0) {
            std::operator+(&fullPath,"Could not create source group for file: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var6 + 1));
            std::__cxx11::string::operator=((string *)errorMsg,(string *)&fullPath);
            std::__cxx11::string::~string((string *)&fullPath);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&tokenizedPath);
            break;
          }
        }
        std::__cxx11::string::string((string *)&fullPath,(string *)(p_Var6 + 1));
        bVar4 = cmsys::SystemTools::FileIsFullPath(*(char **)(p_Var6 + 1));
        if (!bVar4) {
          std::__cxx11::string::_M_assign((string *)&fullPath);
          std::__cxx11::string::append((char *)&fullPath);
          std::__cxx11::string::append((string *)&fullPath);
        }
        cmsys::SystemTools::CollapseFullPath(&local_d8,&fullPath);
        std::__cxx11::string::~string((string *)&fullPath);
        cmSourceGroup::AddGroupFile(this_01,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokenizedPath);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&sourceGroupPaths._M_t);
LAB_0032f1f8:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&filesVector);
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::~string((string *)&root);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmSourceGroupCommand::processTree(const std::vector<std::string>& args,
                                       std::string& errorMsg)
{
  if (!checkTreeArgumentsPreconditions(args, errorMsg)) {
    return false;
  }

  const std::string root = cmSystemTools::CollapseFullPath(args[RootIndex]);
  std::string prefix;
  size_t filesBegin = FilesWithoutPrefixKeywordIndex + 1;
  if (args[PrefixKeywordIndex] == "PREFIX") {
    prefix = args[PrefixKeywordIndex + 1];
    filesBegin = FilesWithPrefixKeywordIndex + 1;
  }

  const std::vector<std::string> filesVector =
    prepareFilesPathsForTree(args.begin() + filesBegin, args.end(),
                             this->Makefile->GetCurrentSourceDirectory());

  if (!rootIsPrefix(root, filesVector, errorMsg)) {
    return false;
  }

  std::set<std::string> sourceGroupPaths =
    getSourceGroupFilesPaths(root, filesVector);

  if (!addFilesToItsSourceGroups(root, sourceGroupPaths, prefix,
                                 *(this->Makefile), errorMsg)) {
    return false;
  }

  return true;
}